

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ReporterRegistry::ReporterRegistry(ReporterRegistry *this)

{
  ReporterRegistryImpl *pRVar1;
  mapped_type *pmVar2;
  allocator<char> local_199;
  key_type local_198;
  unique_ptr<Catch::ReporterFactory<Catch::XmlReporter>_> local_178;
  allocator<char> local_169;
  key_type local_168;
  unique_ptr<Catch::ReporterFactory<Catch::TeamCityReporter>_> local_148;
  allocator<char> local_139;
  key_type local_138;
  unique_ptr<Catch::ReporterFactory<Catch::TAPReporter>_> local_118;
  allocator<char> local_109;
  key_type local_108;
  unique_ptr<Catch::ReporterFactory<Catch::SonarQubeReporter>_> local_e8;
  allocator<char> local_d9;
  key_type local_d8;
  unique_ptr<Catch::ReporterFactory<Catch::JunitReporter>_> local_b8;
  allocator<char> local_a9;
  key_type local_a8;
  unique_ptr<Catch::ReporterFactory<Catch::ConsoleReporter>_> local_88;
  allocator<char> local_79;
  key_type local_78;
  unique_ptr<Catch::ReporterFactory<Catch::CompactReporter>_> local_58;
  allocator<char> local_49;
  key_type local_48;
  unique_ptr<Catch::ReporterFactory<Catch::AutomakeReporter>_> local_18;
  ReporterRegistry *local_10;
  ReporterRegistry *this_local;
  
  local_10 = this;
  Detail::make_unique<Catch::ReporterRegistry::ReporterRegistryImpl>();
  Detail::make_unique<Catch::ReporterFactory<Catch::AutomakeReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"Automake",&local_49);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_48);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_18);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::AutomakeReporter>_>::~unique_ptr(&local_18);
  Detail::make_unique<Catch::ReporterFactory<Catch::CompactReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"compact",&local_79);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_78);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::CompactReporter>_>::~unique_ptr(&local_58);
  Detail::make_unique<Catch::ReporterFactory<Catch::ConsoleReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"console",&local_a9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_a8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::ConsoleReporter>_>::~unique_ptr(&local_88);
  Detail::make_unique<Catch::ReporterFactory<Catch::JunitReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"JUnit",&local_d9);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_d8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::JunitReporter>_>::~unique_ptr(&local_b8);
  Detail::make_unique<Catch::ReporterFactory<Catch::SonarQubeReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"SonarQube",&local_109);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_108);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::SonarQubeReporter>_>::~unique_ptr(&local_e8);
  Detail::make_unique<Catch::ReporterFactory<Catch::TAPReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"TAP",&local_139);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_138);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::TAPReporter>_>::~unique_ptr(&local_118);
  Detail::make_unique<Catch::ReporterFactory<Catch::TeamCityReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"TeamCity",&local_169);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_168);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::TeamCityReporter>_>::~unique_ptr(&local_148);
  Detail::make_unique<Catch::ReporterFactory<Catch::XmlReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->
                     (&this->m_impl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_198,"XML",&local_199);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
           ::operator[](&pRVar1->factories,&local_198);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(pmVar2,&local_178);
  std::__cxx11::string::~string((string *)&local_198);
  std::allocator<char>::~allocator(&local_199);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::XmlReporter>_>::~unique_ptr(&local_178);
  return;
}

Assistant:

ReporterRegistry::ReporterRegistry():
        m_impl( Detail::make_unique<ReporterRegistryImpl>() ) {
        // Because it is impossible to move out of initializer list,
        // we have to add the elements manually
        m_impl->factories["Automake"] =
            Detail::make_unique<ReporterFactory<AutomakeReporter>>();
        m_impl->factories["compact"] =
            Detail::make_unique<ReporterFactory<CompactReporter>>();
        m_impl->factories["console"] =
            Detail::make_unique<ReporterFactory<ConsoleReporter>>();
        m_impl->factories["JUnit"] =
            Detail::make_unique<ReporterFactory<JunitReporter>>();
        m_impl->factories["SonarQube"] =
            Detail::make_unique<ReporterFactory<SonarQubeReporter>>();
        m_impl->factories["TAP"] =
            Detail::make_unique<ReporterFactory<TAPReporter>>();
        m_impl->factories["TeamCity"] =
            Detail::make_unique<ReporterFactory<TeamCityReporter>>();
        m_impl->factories["XML"] =
            Detail::make_unique<ReporterFactory<XmlReporter>>();
    }